

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::add<wasm::Type::BasicType>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,Type option,BasicType rest)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  Type local_30;
  FeatureSet local_28;
  BasicType local_24;
  FeatureOptions<wasm::Type> *pFStack_20;
  BasicType rest_local;
  FeatureOptions<wasm::Type> *this_local;
  Type option_local;
  FeatureSet feature_local;
  
  local_24 = rest;
  pFStack_20 = this;
  this_local = (FeatureOptions<wasm::Type> *)option.id;
  option_local.id._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&option_local.id + 4));
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(this_00,(value_type *)&this_local)
  ;
  local_28.features = option_local.id._4_4_;
  Type::Type(&local_30,local_24);
  pFVar1 = add<>(this,local_28,local_30);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }